

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  cmake *pcVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  cmAlphaNum local_368;
  cmAlphaNum local_338;
  undefined1 local_308 [8];
  string msg_1;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  undefined1 local_260 [8];
  ostringstream e;
  undefined1 local_e8 [8];
  string currentStartFile;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string msg;
  undefined1 local_38 [8];
  string currentStart;
  cmMakefile *mf_local;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = mf;
  InitializeFromParent(mf,this);
  psVar3 = GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)currentStart.field_2._8_8_);
  std::__cxx11::string::string((string *)local_38,(string *)psVar3);
  pcVar4 = GetCMakeInstance(this);
  bVar1 = cmake::GetDebugOutput(pcVar4);
  if (bVar1) {
    cmAlphaNum::cmAlphaNum(&local_98,"   Entering             ");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&currentStartFile.field_2 + 8),(string *)local_38);
    cmStrCat<>((string *)local_68,&local_98,(cmAlphaNum *)((long)&currentStartFile.field_2 + 8));
    cmSystemTools::Message((string *)local_68,(char *)0x0);
    std::__cxx11::string::~string((string *)local_68);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "/CMakeLists.txt");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_e8,true);
  if (bVar1) {
    Configure((cmMakefile *)currentStart.field_2._8_8_);
    pcVar4 = GetCMakeInstance(this);
    bVar1 = cmake::GetDebugOutput(pcVar4);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_338,"   Returning to         ");
      psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_368,psVar3);
      cmStrCat<>((string *)local_308,&local_338,&local_368);
      cmSystemTools::Message((string *)local_308,(char *)0x0);
      std::__cxx11::string::~string((string *)local_308);
    }
    msg_1.field_2._12_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    poVar5 = std::operator<<((ostream *)local_260,"The source directory\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_38);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"does not contain a CMakeLists.txt file.");
    PVar2 = GetPolicyStatus(this,CMP0014,false);
    switch(PVar2) {
    case WARN:
      poVar5 = std::operator<<((ostream *)local_260,"\n");
      poVar5 = std::operator<<(poVar5,"CMake does not support this case but it used ");
      poVar5 = std::operator<<(poVar5,"to work accidentally and is being allowed for ");
      poVar5 = std::operator<<(poVar5,"compatibility.");
      poVar5 = std::operator<<(poVar5,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_280,(cmPolicies *)0xe,id);
      std::operator<<(poVar5,(string *)&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
    case OLD:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      poVar5 = std::operator<<((ostream *)local_260,"\n");
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2c0,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar5,(string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
    case NEW:
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    msg_1.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  }
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}